

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

void __thiscall
duckdb::RowVersionManager::CommitDelete
          (RowVersionManager *this,idx_t vector_idx,transaction_t commit_id,DeleteInfo *info)

{
  ChunkVectorInfo *this_00;
  
  ::std::mutex::lock(&this->version_lock);
  this->has_changes = true;
  this_00 = GetVectorInfo(this,vector_idx);
  ChunkVectorInfo::CommitDelete(this_00,commit_id,info);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void RowVersionManager::CommitDelete(idx_t vector_idx, transaction_t commit_id, const DeleteInfo &info) {
	lock_guard<mutex> lock(version_lock);
	has_changes = true;
	GetVectorInfo(vector_idx).CommitDelete(commit_id, info);
}